

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_> * __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::createWallet
          (Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
           *__return_storage_ptr__,WalletLoaderImpl *this,string *name,SecureString *passphrase,
          uint64_t wallet_creation_flags,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  long lVar1;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> local_120;
  long local_110;
  DatabaseStatus status;
  bilingual_str local_100;
  bilingual_str error;
  DatabaseOptions options;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  options.require_existing = false;
  options.require_create = false;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
  options.create_flags = 0;
  options.create_passphrase._M_dataplus._M_p = (pointer)&options.create_passphrase.field_2;
  options.create_passphrase._M_string_length = 0;
  options.create_passphrase.field_2._M_local_buf[0] = '\0';
  options.verify = true;
  options.use_unsafe_sync = false;
  options.use_shared_memory = false;
  options.max_log_mb = 100;
  ReadDatabaseArgs((this->m_context).args,&options);
  options.require_create = true;
  options.create_flags = wallet_creation_flags;
  _GLOBAL__N_1::std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
  _M_assign((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
            &options.create_passphrase,
            (basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)passphrase);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  CreateWallet((wallet *)&local_120,&this->m_context,(string *)name,(optional<bool>)0x101,&options,
               &status,&error,(vector<bilingual_str,_std::allocator<bilingual_str>_> *)warnings);
  interfaces::MakeWallet((interfaces *)&local_110,&this->m_context,&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_120.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if (local_110 == 0) {
    bilingual_str::bilingual_str(&local_100,&error);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>
                *)__return_storage_ptr__,&local_100);
    bilingual_str::~bilingual_str(&local_100);
  }
  else {
    *(long *)&(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
              .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> =
         local_110;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x40) = '\x01';
  }
  bilingual_str::~bilingual_str(&error);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
            (&options.create_passphrase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<std::unique_ptr<Wallet>> createWallet(const std::string& name, const SecureString& passphrase, uint64_t wallet_creation_flags, std::vector<bilingual_str>& warnings) override
    {
        DatabaseOptions options;
        DatabaseStatus status;
        ReadDatabaseArgs(*m_context.args, options);
        options.require_create = true;
        options.create_flags = wallet_creation_flags;
        options.create_passphrase = passphrase;
        bilingual_str error;
        std::unique_ptr<Wallet> wallet{MakeWallet(m_context, CreateWallet(m_context, name, /*load_on_start=*/true, options, status, error, warnings))};
        if (wallet) {
            return wallet;
        } else {
            return util::Error{error};
        }
    }